

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O0

int mapContinent(Layer *l,int *out,int x,int z,int w,int h)

{
  int iVar1;
  uint64_t s;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  int in_R8D;
  int in_R9D;
  int64_t j;
  int64_t i;
  uint64_t cs;
  uint64_t ss;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  uint64_t ss_00;
  undefined8 local_38;
  
  for (ss_00 = 0; (long)ss_00 < (long)in_R9D; ss_00 = ss_00 + 1) {
    for (local_38 = 0; local_38 < in_R8D; local_38 = local_38 + 1) {
      s = getChunkSeed(ss_00,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      iVar1 = mcFirstIsZero(s,10);
      *(int *)(in_RSI + (ss_00 * (long)in_R8D + local_38) * 4) = iVar1;
    }
  }
  if ((((in_EDX != -in_R8D && SBORROW4(in_EDX,-in_R8D) == in_EDX + in_R8D < 0) && (in_EDX < 1)) &&
      (-in_R9D < in_ECX)) && (in_ECX < 1)) {
    *(undefined4 *)(in_RSI + ((long)-in_ECX * (long)in_R8D - (long)in_EDX) * 4) = 1;
  }
  return 0;
}

Assistant:

int mapContinent(const Layer * l, int * out, int x, int z, int w, int h)
{
    uint64_t ss = l->startSeed;
    uint64_t cs;
    int64_t i, j;

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            cs = getChunkSeed(ss, i + x, j + z);
            out[j*w + i] = mcFirstIsZero(cs, 10);
        }
    }

    if (x > -w && x <= 0 && z > -h && z <= 0)
    {
        out[-z * (int64_t)w - x] = 1;
    }

    return 0;
}